

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,long),char_data*&,long&>
          (CQueue *this,int nTimer,string *from,string *funcName,_func_void_char_data_ptr_long *func
          ,char_data **args,long *args_1)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_long *local_f8;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_d8 [40];
  string local_b0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_90;
  function<void()> local_78 [32];
  tuple<char_data_*&,_long_&> tuple;
  anon_class_24_3_3bdf3dc2 local_48;
  
  nTimer_local = nTimer;
  local_f8 = func;
  if (nTimer < 0) {
    local_d8._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_d8);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_long_&>.super__Tuple_impl<1UL,_long_&>.
  super__Head_base<1UL,_long_&,_false>._M_head_impl =
       (_Head_base<1UL,_long_&,_false>)(_Head_base<1UL,_long_&,_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_long_&>.super__Head_base<0UL,_char_data_*&,_false>.
  _M_head_impl = args;
  GetCharacterData<char_data*&,long&>(&chs,this,&tuple);
  local_d8._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_d8 + 8),(string *)from);
  std::__cxx11::string::string(local_b0,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_90,&chs);
  local_48.func = local_f8;
  local_48.args = *args;
  local_48._16_8_ = *args_1;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,long),char_data*&,long&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,long),char_data*&,long&)::_lambda()_1_,void>
            (local_78,&local_48);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_d8);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_d8);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}